

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
google::protobuf::Arena::Create<std::__cxx11::string,std::__cxx11::string&>
          (Arena *arena,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  Arena *arena_local;
  _func_void_void_ptr *destructor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  if (arena == (Arena *)0x0) {
    local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    std::__cxx11::string::string((string *)local_10,(string *)args);
  }
  else {
    local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               AllocateInternal(arena,0x20,8,internal::arena_destruct_object<std::__cxx11::string>,
                                (type_info *)&std::__cxx11::string::typeinfo);
    std::__cxx11::string::string((string *)local_10,(string *)args);
  }
  return local_10;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* Create(Arena* arena, Args&&... args) {
    return CreateInternal<T>(arena, std::is_convertible<T*, MessageLite*>(),
                             static_cast<Args&&>(args)...);
  }